

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search.c
# Opt level: O0

int ngram_search_start(ps_search_t *search)

{
  ngram_search_t *ngs;
  ps_search_t *search_local;
  
  *(undefined1 *)((long)&search[1].name + 3) = 0;
  ngram_model_flush((ngram_model_t *)search[1].vt);
  if (*(char *)&search[1].name == '\0') {
    if (*(char *)((long)&search[1].name + 1) == '\0') {
      return -1;
    }
    ngram_fwdflat_start((ngram_search_t *)search);
  }
  else {
    ngram_fwdtree_start((ngram_search_t *)search);
  }
  return 0;
}

Assistant:

static int
ngram_search_start(ps_search_t *search)
{
    ngram_search_t *ngs = (ngram_search_t *)search;

    ngs->done = FALSE;
    ngram_model_flush(ngs->lmset);
    if (ngs->fwdtree)
        ngram_fwdtree_start(ngs);
    else if (ngs->fwdflat)
        ngram_fwdflat_start(ngs);
    else
        return -1;
    return 0;
}